

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForData(pollfd *fds,nfds_t count,double *timeout)

{
  bool bVar1;
  GLFWbool GVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  int *piVar6;
  uint64_t uVar7;
  long lVar8;
  GLFWbool unaff_R12D;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timespec ts;
  timespec local_58;
  double local_48;
  double dStack_40;
  
  do {
    while (timeout == (double *)0x0) {
      iVar4 = poll((pollfd *)fds,count,-1);
      if (iVar4 < 1) {
        if (iVar4 == -1) {
          piVar6 = __errno_location();
          if (*piVar6 != 0xb) {
            bVar1 = false;
            GVar2 = 0;
            if (*piVar6 != 4) goto LAB_002460b4;
          }
        }
        bVar1 = true;
        GVar2 = unaff_R12D;
      }
      else {
        bVar1 = false;
        GVar2 = 1;
      }
LAB_002460b4:
      unaff_R12D = GVar2;
      if (!bVar1) {
        return unaff_R12D;
      }
    }
    uVar5 = _glfwPlatformGetTimerValue();
    local_58.tv_sec = (__time_t)*timeout;
    local_58.tv_nsec = (long)((*timeout - (double)local_58.tv_sec) * 1000000000.0);
    bVar1 = false;
    iVar3 = ppoll((pollfd *)fds,count,&local_58,(__sigset_t *)0x0);
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    uVar7 = _glfwPlatformGetTimerValue();
    lVar8 = uVar7 - uVar5;
    auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = 0x45300000;
    dStack_40 = auVar10._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    uVar5 = _glfwPlatformGetTimerFrequency();
    auVar11._8_4_ = (int)(uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    dVar9 = *timeout -
            local_48 /
            ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
    *timeout = dVar9;
    if (iVar3 < 1) {
      if ((iVar3 == -1) && (iVar4 != 0xb)) {
        bVar1 = false;
        GVar2 = 0;
        if (iVar4 != 4) goto LAB_0024609c;
      }
      bVar1 = 0.0 < dVar9;
      GVar2 = unaff_R12D;
      if (!bVar1) {
        GVar2 = 0;
      }
    }
    else {
      GVar2 = 1;
    }
LAB_0024609c:
    unaff_R12D = GVar2;
    if (!bVar1) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

static GLFWbool waitForData(struct pollfd* fds, nfds_t count, double* timeout)
{
    for (;;)
    {
        if (timeout)
        {
            const uint64_t base = _glfwPlatformGetTimerValue();

#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) || defined(__CYGWIN__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = ppoll(fds, count, &ts, NULL);
#elif defined(__NetBSD__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = pollts(fds, count, &ts, NULL);
#else
            const int milliseconds = (int) (*timeout * 1e3);
            const int result = poll(fds, count, milliseconds);
#endif
            const int error = errno; // clock_gettime may overwrite our error

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && error != EINTR && error != EAGAIN)
                return GLFW_FALSE;
            else if (*timeout <= 0.0)
                return GLFW_FALSE;
        }
        else
        {
            const int result = poll(fds, count, -1);
            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && errno != EINTR && errno != EAGAIN)
                return GLFW_FALSE;
        }
    }
}